

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

HashEntry * raviX_hash_table_search_pre_hashed(HashTable *ht,uint32_t hash,void *key)

{
  HashEntry *pHVar1;
  uint32_t *puVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  HashEntry *unaff_RBP;
  ulong uVar6;
  
  uVar3 = (ulong)hash % (ulong)ht->size;
  uVar6 = uVar3;
  while( true ) {
    puVar2 = (uint32_t *)ht->table[uVar6].key;
    if (puVar2 == (uint32_t *)0x0) {
      unaff_RBP = (HashEntry *)0x0;
      bVar4 = false;
    }
    else if (((puVar2 == &deleted_key_value) || (pHVar1 = ht->table + uVar6, pHVar1->hash != hash))
            || (iVar5 = (*ht->key_equals_function)(key,puVar2), iVar5 == 0)) {
      uVar6 = (ulong)((int)uVar6 + 1 + hash % ht->rehash) % (ulong)ht->size;
      bVar4 = true;
    }
    else {
      bVar4 = false;
      unaff_RBP = pHVar1;
    }
    if (!bVar4) break;
    if ((int)uVar6 == (int)uVar3) {
      return (HashEntry *)0x0;
    }
  }
  return unaff_RBP;
}

Assistant:

HashEntry *
raviX_hash_table_search_pre_hashed(HashTable *ht, uint32_t hash,
			     const void *key)
{
	uint32_t start_hash_address = hash % ht->size;
	uint32_t hash_address = start_hash_address;

	do {
		uint32_t double_hash;

		HashEntry *entry = ht->table + hash_address;

		if (entry_is_free(entry)) {
			return NULL;
		} else if (entry_is_present(entry) && entry->hash == hash) {
			if (ht->key_equals_function(key, entry->key)) {
				return entry;
			}
		}

		double_hash = 1 + hash % ht->rehash;

		hash_address = (hash_address + double_hash) % ht->size;
	} while (hash_address != start_hash_address);

	return NULL;
}